

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void duckdb::QuantileOperation::
     ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (QuantileState<float,_duckdb::QuantileStandardType> *state,float *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    Operation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
              (state,input,unary_input);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}